

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-predicate.c
# Opt level: O0

_Bool monster_is_esp_detectable(monster *mon)

{
  _Bool _Var1;
  bitflag local_23 [8];
  bitflag flags [11];
  monster *mon_local;
  
  flags._3_8_ = mon;
  flag_copy(local_23,mon->race->flags,0xb);
  if (*(long *)(flags._3_8_ + 8) != 0) {
    flag_inter(local_23,(bitflag *)(*(long *)(flags._3_8_ + 8) + 0x5c),0xb);
  }
  _Var1 = flag_has_dbg(local_23,0xb,0x2a,"flags","RF_EMPTY_MIND");
  if (_Var1) {
    mon_local._7_1_ = false;
  }
  else {
    _Var1 = flag_has_dbg((bitflag *)(*(long *)flags._3_8_ + 0x5c),0xb,0x2b,"mon->race->flags",
                         "RF_WEIRD_MIND");
    if ((_Var1) && (*(int *)(flags._3_8_ + 0x10) % 10 != 5)) {
      mon_local._7_1_ = false;
    }
    else {
      mon_local._7_1_ = true;
    }
  }
  return mon_local._7_1_;
}

Assistant:

bool monster_is_esp_detectable(const struct monster *mon)
{
	bitflag flags[RF_SIZE];
	rf_copy(flags, mon->race->flags);
	if (mon->original_race) {
		rf_inter(flags, mon->original_race->flags);
	}
	if (rf_has(flags, RF_EMPTY_MIND)) {
		/* Empty mind, no telepathy */
		return false;
	} else if (rf_has(mon->race->flags, RF_WEIRD_MIND)) {
		/* Weird mind, one in ten individuals are detectable */
		if ((mon->midx % 10) != 5) {
			/* Undetectable */
			return false;
		}
	}

	return true;
}